

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,long,CScript>(DataStream *s,long *args,CScript *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata64<DataStream>(s,*args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<DataStream,28u,unsigned_char>(s,&args_1->super_CScriptBase);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}